

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_shader * rf_gfx_load_shader(rf_shader *__return_storage_ptr__,char *vs_code,char *fs_code)

{
  rf_source_location source_location;
  uint uVar1;
  rf_shader *shader;
  uint local_15c;
  uint location;
  uint type;
  char name [256];
  int local_50;
  int local_4c;
  int num;
  int namelen;
  rf_int i;
  char *pcStack_38;
  int uniform_count;
  char *local_30;
  undefined8 local_28;
  uint local_20;
  uint local_1c;
  uint fragment_shader_id;
  uint vertex_shader_id;
  char *fs_code_local;
  char *vs_code_local;
  
  _fragment_shader_id = fs_code;
  fs_code_local = vs_code;
  memset(__return_storage_ptr__,0,0x84);
  memset(__return_storage_ptr__->locs,0xff,0x80);
  local_1c = (rf__ctx->field_0).default_vertex_shader_id;
  local_20 = (rf__ctx->field_0).default_frag_shader_id;
  if (fs_code_local != (char *)0x0) {
    local_1c = rf_compile_shader(fs_code_local,0x8b31);
  }
  if (_fragment_shader_id != (char *)0x0) {
    local_20 = rf_compile_shader(_fragment_shader_id,0x8b30);
  }
  if ((local_1c == (rf__ctx->field_0).default_vertex_shader_id) &&
     (local_20 == (rf__ctx->field_0).default_frag_shader_id)) {
    memcpy(__return_storage_ptr__,&(rf__ctx->field_0).default_shader,0x84);
  }
  else {
    uVar1 = rf_load_shader_program(local_1c,local_20);
    __return_storage_ptr__->id = uVar1;
    if (local_1c != (rf__ctx->field_0).default_vertex_shader_id) {
      (*(rf__ctx->field_0).gfx_ctx.gl.DeleteShader)(local_1c);
    }
    if (local_20 != (rf__ctx->field_0).default_frag_shader_id) {
      (*(rf__ctx->field_0).gfx_ctx.gl.DeleteShader)(local_20);
    }
    if (__return_storage_ptr__->id == 0) {
      pcStack_38 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      local_30 = "rf_gfx_load_shader";
      local_28 = 0x9a25;
      rf_log_impl(4,0x1b3a37);
      memcpy(__return_storage_ptr__,&(rf__ctx->field_0).default_shader,0x84);
    }
    if (__return_storage_ptr__->id != 0) {
      rf_set_shader_default_locations(__return_storage_ptr__);
    }
  }
  i._4_4_ = -1;
  (*(rf__ctx->field_0).gfx_ctx.gl.GetProgramiv)
            (__return_storage_ptr__->id,0x8b86,(int *)((long)&i + 4));
  for (_num = 0; _num < i._4_4_; _num = _num + 1) {
    local_4c = -1;
    local_50 = -1;
    local_15c = 0;
    (*(rf__ctx->field_0).gfx_ctx.gl.GetActiveUniform)
              (__return_storage_ptr__->id,(uint)_num,0xff,&local_4c,&local_50,&local_15c,
               (char *)&location);
    *(undefined1 *)((long)&location + (long)local_4c) = 0;
    uVar1 = (*(rf__ctx->field_0).gfx_ctx.gl.GetUniformLocation)
                      (__return_storage_ptr__->id,(char *)&location);
    source_location.proc_name = "rf_gfx_load_shader";
    source_location.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    source_location.line_in_file = 0x9a42;
    rf_log_impl(source_location,RF_LOG_TYPE_DEBUG,
                "[SHDR ID %i] Active uniform [%s] set at location: %i",
                (ulong)__return_storage_ptr__->id,&location,(ulong)uVar1,"rf_gfx_load_shader");
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_shader rf_gfx_load_shader(const char* vs_code, const char* fs_code)
{
    rf_shader shader = { 0 };
    memset(shader.locs, -1, sizeof(shader.locs));

    unsigned int vertex_shader_id   = rf_ctx.default_vertex_shader_id;
    unsigned int fragment_shader_id = rf_ctx.default_frag_shader_id;

    if (vs_code != NULL) vertex_shader_id   = rf_compile_shader(vs_code, GL_VERTEX_SHADER);
    if (fs_code != NULL) fragment_shader_id = rf_compile_shader(fs_code, GL_FRAGMENT_SHADER);

    if ((vertex_shader_id == rf_ctx.default_vertex_shader_id) && (fragment_shader_id == rf_ctx.default_frag_shader_id)) shader = rf_ctx.default_shader;
    else
    {
        shader.id = rf_load_shader_program(vertex_shader_id, fragment_shader_id);

        if (vertex_shader_id != rf_ctx.default_vertex_shader_id) rf_gl.DeleteShader(vertex_shader_id);
        if (fragment_shader_id != rf_ctx.default_frag_shader_id) rf_gl.DeleteShader(fragment_shader_id);

        if (shader.id == 0)
        {
            RF_LOG(RF_LOG_TYPE_WARNING, "Custom shader could not be loaded");
            shader = rf_ctx.default_shader;
        }

        // After shader loading, we TRY to set default location names
        if (shader.id > 0) rf_set_shader_default_locations(&shader);
    }

    // Get available shader uniforms
    // NOTE: This information is useful for debug...
    int uniform_count = -1;

    rf_gl.GetProgramiv(shader.id, GL_ACTIVE_UNIFORMS, &uniform_count);

    for (rf_int i = 0; i < uniform_count; i++)
    {
        int namelen = -1;
        int num = -1;
        char name[256]; // Assume no variable names longer than 256
        unsigned int type = GL_ZERO;

        // Get the name of the uniforms
        rf_gl.GetActiveUniform(shader.id, i,sizeof(name) - 1, &namelen, &num, &type, name);

        name[namelen] = 0;

        // Get the location of the named uniform
        unsigned int location = rf_gl.GetUniformLocation(shader.id, name);

        RF_LOG(RF_LOG_TYPE_DEBUG, "[SHDR ID %i] Active uniform [%s] set at location: %i", shader.id, name, location);
    }

    return shader;
}